

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::Image::ImageFormatCase::ImageFormatCase
          (ImageFormatCase *this,EglTestContext *eglTestCtx,TestSpec *spec)

{
  TextureFormat local_38;
  
  TestCase::TestCase(&this->super_TestCase,eglTestCtx,(spec->name)._M_dataplus._M_p,
                     (spec->desc)._M_dataplus._M_p);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ImageFormatCase_021209a0;
  glu::CallLogWrapper::CallLogWrapper
            (&this->super_CallLogWrapper,&this->m_gl,eglTestCtx->m_testCtx->m_log);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ImageFormatCase_021209a0;
  TestSpec::TestSpec(&this->m_spec,spec);
  (this->m_img).super_UniqueBase<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>.m_data.
  ptr = (UniqueImage *)0x0;
  (this->m_apiContexts).
  super__Vector_base<deqp::egl::Image::ImageApi_*,_std::allocator<deqp::egl::Image::ImageApi_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_apiContexts).
  super__Vector_base<deqp::egl::Image::ImageApi_*,_std::allocator<deqp::egl::Image::ImageApi_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_apiContexts).
  super__Vector_base<deqp::egl::Image::ImageApi_*,_std::allocator<deqp::egl::Image::ImageApi_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_display = (EGLDisplay)0x0;
  this->m_window = (NativeWindow *)0x0;
  this->m_surface = (EGLSurface)0x0;
  *(undefined8 *)((long)&this->m_surface + 4) = 0;
  *(undefined8 *)((long)&this->m_config + 4) = 0;
  local_38.order = RGBA;
  local_38.type = UNORM_INT8;
  tcu::Texture2D::Texture2D(&this->m_refImg,&local_38,1,1);
  glw::Functions::Functions(&this->m_gl);
  return;
}

Assistant:

ImageFormatCase::ImageFormatCase (EglTestContext& eglTestCtx, const TestSpec& spec)
	: TestCase				(eglTestCtx, spec.name.c_str(), spec.desc.c_str())
	, glu::CallLogWrapper	(m_gl, eglTestCtx.getTestContext().getLog())
	, m_spec				(spec)
	, m_display				(EGL_NO_DISPLAY)
	, m_window				(DE_NULL)
	, m_surface				(EGL_NO_SURFACE)
	, m_config				(0)
	, m_curIter				(0)
	, m_refImg				(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), 1, 1)
{
}